

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O2

bool s2textformat::MakeLaxPolygon
               (string_view str,
               unique_ptr<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_> *lax_polygon)

{
  S2LaxPolygonShape *pSVar1;
  string_view y;
  pointer pVVar2;
  bool bVar3;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices;
  char in_R8B;
  pointer psVar4;
  string_view str_00;
  string_view sVar5;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> points;
  vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  loops;
  string_view local_68;
  string_view local_58;
  vector<absl::string_view,_std::allocator<absl::string_view>_> loop_strs;
  
  sVar5.length_ = 0x3b;
  sVar5.ptr_ = (char *)str.length_;
  SplitString(&loop_strs,(s2textformat *)str.ptr_,sVar5,in_R8B);
  loops.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loops.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  loops.
  super__Vector_base<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar4 = loop_strs.super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if (psVar4 == loop_strs.
                  super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      absl::
      make_unique<S2LaxPolygonShape,std::vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>&>
                ((absl *)&points,&loops);
      pVVar2 = points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
               .super__Vector_impl_data._M_start;
      points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pSVar1 = (lax_polygon->_M_t).
               super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>.
               _M_t.
               super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>.
               super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl;
      (lax_polygon->_M_t).
      super___uniq_ptr_impl<S2LaxPolygonShape,_std::default_delete<S2LaxPolygonShape>_>._M_t.
      super__Tuple_impl<0UL,_S2LaxPolygonShape_*,_std::default_delete<S2LaxPolygonShape>_>.
      super__Head_base<0UL,_S2LaxPolygonShape_*,_false>._M_head_impl = (S2LaxPolygonShape *)pVVar2;
      if (pSVar1 != (S2LaxPolygonShape *)0x0) {
        (**(code **)((long)(pSVar1->super_S2Shape)._vptr_S2Shape + 8))();
        if (points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)((long)(points.
                              super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->c_[0] + 8))();
        }
      }
LAB_00262f97:
      std::
      vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
      ::~vector(&loops);
      std::_Vector_base<absl::string_view,_std::allocator<absl::string_view>_>::~_Vector_base
                (&loop_strs.
                  super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>);
      return psVar4 == loop_strs.
                       super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
    }
    sVar5 = *psVar4;
    absl::string_view::string_view(&local_58,"full");
    bVar3 = absl::operator==(sVar5,local_58);
    if (bVar3) {
      points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
      ::emplace_back<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
                ((vector<std::vector<Vector3<double>,std::allocator<Vector3<double>>>,std::allocator<std::vector<Vector3<double>,std::allocator<Vector3<double>>>>>
                  *)&loops,&points);
LAB_00262f41:
      std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base
                (&points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>);
    }
    else {
      sVar5 = *psVar4;
      absl::string_view::string_view(&local_68,"empty");
      y.length_ = local_68.length_;
      y.ptr_ = local_68.ptr_;
      vertices = (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_68.length_;
      bVar3 = absl::operator!=(sVar5,y);
      if (bVar3) {
        points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        str_00.length_ = (size_type)&points;
        str_00.ptr_ = (char *)psVar4->length_;
        bVar3 = ParsePoints((s2textformat *)psVar4->ptr_,str_00,vertices);
        if (bVar3) {
          std::
          vector<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>,_std::allocator<std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>_>_>
          ::push_back(&loops,&points);
          goto LAB_00262f41;
        }
        std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base
                  (&points.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>);
        goto LAB_00262f97;
      }
    }
    psVar4 = psVar4 + 1;
  } while( true );
}

Assistant:

bool MakeLaxPolygon(string_view str,
                    unique_ptr<S2LaxPolygonShape>* lax_polygon) {
  vector<string_view> loop_strs = SplitString(str, ';');
  vector<vector<S2Point>> loops;
  for (const auto& loop_str : loop_strs) {
    if (loop_str == "full") {
      loops.push_back(vector<S2Point>());
    } else if (loop_str != "empty") {
      vector<S2Point> points;
      if (!ParsePoints(loop_str, &points)) return false;
      loops.push_back(points);
    }
  }
  *lax_polygon = make_unique<S2LaxPolygonShape>(loops);
  return true;
}